

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O2

void rhash_sha3_process_block(uint64_t *hash,uint64_t *block,size_t block_size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint64_t uVar24;
  ulong uVar25;
  uint64_t uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  
  local_f8 = *hash ^ *block;
  *hash = local_f8;
  uVar27 = hash[1] ^ block[1];
  hash[1] = uVar27;
  uVar1 = hash[2] ^ block[2];
  hash[2] = uVar1;
  local_100 = hash[3] ^ block[3];
  hash[3] = local_100;
  uVar30 = hash[4] ^ block[4];
  hash[4] = uVar30;
  uVar19 = hash[5] ^ block[5];
  hash[5] = uVar19;
  uVar2 = hash[6] ^ block[6];
  hash[6] = uVar2;
  local_f0 = hash[7] ^ block[7];
  hash[7] = local_f0;
  local_110 = hash[8] ^ block[8];
  hash[8] = local_110;
  local_108 = hash[9];
  if (block_size < 0x49) {
    local_d0 = hash[10];
    uVar5 = hash[0xb];
    local_120 = hash[0xc];
  }
  else {
    local_108 = local_108 ^ block[9];
    hash[9] = local_108;
    local_d0 = hash[10] ^ block[10];
    hash[10] = local_d0;
    uVar5 = hash[0xb] ^ block[0xb];
    hash[0xb] = uVar5;
    local_120 = hash[0xc] ^ block[0xc];
    hash[0xc] = local_120;
    if (0x68 < block_size) {
      hash[0xd] = hash[0xd] ^ block[0xd];
      hash[0xe] = hash[0xe] ^ block[0xe];
      hash[0xf] = hash[0xf] ^ block[0xf];
      hash[0x10] = hash[0x10] ^ block[0x10];
      if (0x88 < block_size) {
        hash[0x11] = hash[0x11] ^ block[0x11];
      }
    }
  }
  local_e8 = hash[0x10];
  local_c8 = hash[0x15];
  local_118 = hash[0xd];
  uVar18 = hash[0xe];
  uVar24 = hash[0x13];
  uVar26 = hash[0x18];
  uVar23 = hash[0x11];
  uVar13 = hash[0x16];
  uVar22 = hash[0xf];
  local_c0 = hash[0x14];
  local_b0 = hash[0x12];
  local_b8 = hash[0x17];
  for (lVar4 = 0; lVar4 != 0xc0; lVar4 = lVar4 + 8) {
    uVar3 = uVar5 ^ uVar2 ^ local_e8 ^ local_c8 ^ uVar27;
    uVar8 = uVar26 ^ uVar24 ^ uVar18 ^ local_108 ^ uVar30 ^ (uVar3 << 1 | (ulong)((long)uVar3 < 0));
    uVar3 = local_120 ^ local_f0 ^ uVar23 ^ uVar13 ^ uVar1;
    uVar3 = local_c0 ^ uVar22 ^ local_d0 ^ uVar19 ^ local_f8 ^
            (uVar3 << 1 | (ulong)((long)uVar3 < 0));
    uVar20 = local_118 ^ local_110 ^ local_b0 ^ local_b8 ^ local_100;
    uVar6 = uVar18 ^ local_108 ^ uVar26 ^ uVar24 ^ uVar30;
    uVar10 = local_e8 ^ local_c8 ^ uVar5 ^ uVar2 ^ uVar27 ^
             (uVar20 << 1 | (ulong)((long)uVar20 < 0));
    uVar12 = uVar23 ^ uVar13 ^ local_120 ^ local_f0 ^ uVar1 ^
             (uVar6 << 1 | (ulong)((long)uVar6 < 0));
    uVar20 = uVar8 ^ local_d0;
    uVar6 = local_d0 ^ uVar19 ^ local_c0 ^ uVar22 ^ local_f8;
    uVar16 = local_b0 ^ local_b8 ^ local_118 ^ local_110 ^ local_100 ^
             (uVar6 << 1 | (ulong)((long)uVar6 < 0));
    local_f8 = local_f8 ^ uVar8;
    uVar6 = uVar27 ^ uVar3;
    uVar28 = uVar5 ^ uVar3;
    uVar31 = uVar1 ^ uVar10;
    uVar14 = local_100 ^ uVar12;
    uVar32 = uVar30 ^ uVar16;
    uVar11 = (uVar2 ^ uVar3) << 0x2c | (uVar2 ^ uVar3) >> 0x14;
    uVar2 = (local_120 ^ uVar10) << 0x2b | (local_120 ^ uVar10) >> 0x15;
    uVar1 = (local_b0 ^ uVar12) << 0x15 | (local_b0 ^ uVar12) >> 0x2b;
    uVar30 = (uVar16 ^ uVar26) << 0xe | (uVar16 ^ uVar26) >> 0x32;
    uVar27 = ~uVar2 & uVar1 ^ uVar11;
    local_100 = ~uVar30 & local_f8 ^ uVar1;
    uVar1 = ~uVar1 & uVar30 ^ uVar2;
    uVar29 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
    uVar7 = (local_f0 ^ uVar10) << 6 | (local_f0 ^ uVar10) >> 0x3a;
    uVar5 = (local_118 ^ uVar12) << 0x19 | (local_118 ^ uVar12) >> 0x27;
    uVar15 = (uVar24 ^ uVar16) << 8 | (uVar24 ^ uVar16) >> 0x38;
    uVar9 = (uVar8 ^ local_c0) << 0x12 | (uVar8 ^ local_c0) >> 0x2e;
    uVar30 = ~local_f8 & uVar11 ^ uVar30;
    local_d0 = ~uVar7 & uVar5 ^ uVar29;
    local_120 = ~uVar15 & uVar9 ^ uVar5;
    uVar5 = ~uVar5 & uVar15 ^ uVar7;
    uVar21 = uVar31 << 0x3e | uVar31 >> 2;
    uVar17 = (local_110 ^ uVar12) << 0x37 | (local_110 ^ uVar12) >> 9;
    uVar6 = (uVar18 ^ uVar16) << 0x27 | (uVar18 ^ uVar16) >> 0x19;
    uVar31 = (uVar22 ^ uVar8) << 0x29 | (uVar22 ^ uVar8) >> 0x17;
    uVar25 = (uVar3 ^ local_c8) << 2 | (uVar3 ^ local_c8) >> 0x3e;
    local_c0 = ~uVar17 & uVar6 ^ uVar21;
    local_c8 = ~uVar6 & uVar31 ^ uVar17;
    local_f8 = local_f8 ^ ~uVar11 & uVar2 ^ *(ulong *)((long)keccak_round_constants + lVar4);
    uVar18 = uVar14 << 0x1c | uVar14 >> 0x24;
    uVar14 = uVar32 << 0x1b | uVar32 >> 0x25;
    uVar8 = (uVar19 ^ uVar8) << 0x24 | (uVar19 ^ uVar8) >> 0x1c;
    uVar11 = (local_108 ^ uVar16) << 0x14 | (local_108 ^ uVar16) >> 0x2c;
    uVar16 = uVar20 << 3 | uVar20 >> 0x3d;
    uVar20 = uVar28 << 10 | uVar28 >> 0x36;
    uVar2 = (local_e8 ^ uVar3) << 0x2d | (local_e8 ^ uVar3) >> 0x13;
    uVar23 = (uVar23 ^ uVar10) << 0xf | (uVar23 ^ uVar10) >> 0x31;
    local_108 = (uVar10 ^ uVar13) << 0x3d | (uVar10 ^ uVar13) >> 3;
    uVar13 = (uVar12 ^ local_b8) << 0x38 | (uVar12 ^ local_b8) >> 8;
    local_110 = ~local_108 & uVar18 ^ uVar2;
    uVar22 = ~uVar8 & uVar20 ^ uVar14;
    local_e8 = ~uVar20 & uVar23 ^ uVar8;
    local_f0 = ~uVar2 & local_108 ^ uVar16;
    uVar19 = ~uVar11 & uVar16 ^ uVar18;
    uVar2 = ~uVar16 & uVar2 ^ uVar11;
    local_108 = uVar11 & ~uVar18 ^ local_108;
    local_118 = ~uVar9 & uVar29 ^ uVar15;
    uVar18 = ~uVar29 & uVar7 ^ uVar9;
    local_b0 = ~uVar13 & uVar14 ^ uVar23;
    uVar23 = ~uVar23 & uVar13 ^ uVar20;
    uVar24 = ~uVar14 & uVar8 ^ uVar13;
    local_b8 = ~uVar25 & uVar21 ^ uVar31;
    uVar13 = ~uVar31 & uVar25 ^ uVar6;
    uVar26 = ~uVar21 & uVar17 ^ uVar25;
  }
  hash[1] = uVar27;
  hash[6] = uVar2;
  hash[0xb] = uVar5;
  hash[0x10] = local_e8;
  hash[0x15] = local_c8;
  hash[4] = uVar30;
  hash[9] = local_108;
  hash[0xe] = uVar18;
  hash[0x13] = uVar24;
  hash[0x18] = uVar26;
  hash[2] = uVar1;
  hash[7] = local_f0;
  hash[0xc] = local_120;
  hash[0x11] = uVar23;
  hash[0x16] = uVar13;
  *hash = local_f8;
  hash[5] = uVar19;
  hash[10] = local_d0;
  hash[0xf] = uVar22;
  hash[0x14] = local_c0;
  hash[3] = local_100;
  hash[8] = local_110;
  hash[0xd] = local_118;
  hash[0x12] = local_b0;
  hash[0x17] = local_b8;
  return;
}

Assistant:

static void rhash_sha3_process_block(uint64_t hash[25], const uint64_t* block, size_t block_size)
{
	/* expanded loop */
	hash[ 0] ^= le2me_64(block[ 0]);
	hash[ 1] ^= le2me_64(block[ 1]);
	hash[ 2] ^= le2me_64(block[ 2]);
	hash[ 3] ^= le2me_64(block[ 3]);
	hash[ 4] ^= le2me_64(block[ 4]);
	hash[ 5] ^= le2me_64(block[ 5]);
	hash[ 6] ^= le2me_64(block[ 6]);
	hash[ 7] ^= le2me_64(block[ 7]);
	hash[ 8] ^= le2me_64(block[ 8]);
	/* if not sha3-512 */
	if (block_size > 72) {
		hash[ 9] ^= le2me_64(block[ 9]);
		hash[10] ^= le2me_64(block[10]);
		hash[11] ^= le2me_64(block[11]);
		hash[12] ^= le2me_64(block[12]);
		/* if not sha3-384 */
		if (block_size > 104) {
			hash[13] ^= le2me_64(block[13]);
			hash[14] ^= le2me_64(block[14]);
			hash[15] ^= le2me_64(block[15]);
			hash[16] ^= le2me_64(block[16]);
			/* if not sha3-256 */
			if (block_size > 136) {
				hash[17] ^= le2me_64(block[17]);
#ifdef FULL_SHA3_FAMILY_SUPPORT
				/* if not sha3-224 */
				if (block_size > 144) {
					hash[18] ^= le2me_64(block[18]);
					hash[19] ^= le2me_64(block[19]);
					hash[20] ^= le2me_64(block[20]);
					hash[21] ^= le2me_64(block[21]);
					hash[22] ^= le2me_64(block[22]);
					hash[23] ^= le2me_64(block[23]);
					hash[24] ^= le2me_64(block[24]);
				}
#endif
			}
		}
	}
	/* make a permutation of the hash */
	rhash_sha3_permutation(hash);
}